

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intMan.c
# Opt level: O0

void Inter_ManClean(Inter_Man_t *p)

{
  int iVar1;
  Aig_Man_t *p_00;
  int local_1c;
  int i;
  Aig_Man_t *pMan;
  Inter_Man_t *p_local;
  
  if (p->vInters != (Vec_Ptr_t *)0x0) {
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vInters), local_1c < iVar1; local_1c = local_1c + 1) {
      p_00 = (Aig_Man_t *)Vec_PtrEntry(p->vInters,local_1c);
      Aig_ManStop(p_00);
    }
    Vec_PtrClear(p->vInters);
  }
  if (p->pCnfInter != (Cnf_Dat_t *)0x0) {
    Cnf_DataFree(p->pCnfInter);
  }
  if (p->pCnfFrames != (Cnf_Dat_t *)0x0) {
    Cnf_DataFree(p->pCnfFrames);
  }
  if (p->pInter != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pInter);
  }
  if (p->pFrames != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pFrames);
  }
  return;
}

Assistant:

void Inter_ManClean( Inter_Man_t * p )
{
    if ( p->vInters )
    {
        Aig_Man_t * pMan;
        int i;
        Vec_PtrForEachEntry( Aig_Man_t *, p->vInters, pMan, i )
            Aig_ManStop( pMan );
        Vec_PtrClear( p->vInters );
    }
    if ( p->pCnfInter )
        Cnf_DataFree( p->pCnfInter );
    if ( p->pCnfFrames )
        Cnf_DataFree( p->pCnfFrames );
    if ( p->pInter )
        Aig_ManStop( p->pInter );
    if ( p->pFrames )
        Aig_ManStop( p->pFrames );
}